

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O1

void __thiscall re2c::Skeleton::emit_end(Skeleton *this,OutputFile *o,bool backup,bool backupctx)

{
  OutputFile *pOVar1;
  undefined3 in_register_00000011;
  
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"}");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"if (status == 0) {");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  OutputFile::ws(pOVar1,"if (cursor != eof) {");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,3);
  OutputFile::ws(pOVar1,"status = 1;");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,3);
  OutputFile::ws(pOVar1,"const long pos = token - input;");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,3);
  pOVar1 = OutputFile::ws(pOVar1,"fprintf(stderr, \"error: lex_");
  pOVar1 = OutputFile::wstring(pOVar1,&this->name);
  OutputFile::ws(pOVar1,": unused input strings left at position %ld\\n\", pos);");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  OutputFile::ws(pOVar1,"}");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  OutputFile::ws(pOVar1,"if (i != keys_count) {");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,3);
  OutputFile::ws(pOVar1,"status = 1;");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,3);
  pOVar1 = OutputFile::ws(pOVar1,"fprintf(stderr, \"error: lex_");
  pOVar1 = OutputFile::wstring(pOVar1,&this->name);
  OutputFile::ws(pOVar1,": unused keys left after %u iterations\\n\", i);");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  OutputFile::ws(pOVar1,"}");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"}");
  OutputFile::ws(o,"\n");
  OutputFile::ws(o,"\nend:");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"free(input);");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"free(keys);");
  OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"return status;");
  OutputFile::ws(o,"\n}");
  OutputFile::ws(o,"\n");
  OutputFile::ws(o,"\n#undef YYCTYPE");
  OutputFile::ws(o,"\n#undef YYKEYTYPE");
  OutputFile::ws(o,"\n#undef YYPEEK");
  OutputFile::ws(o,"\n#undef YYSKIP");
  if (CONCAT31(in_register_00000011,backup) != 0) {
    OutputFile::ws(o,"\n#undef YYBACKUP");
    OutputFile::ws(o,"\n#undef YYRESTORE");
  }
  if (backupctx) {
    OutputFile::ws(o,"\n#undef YYBACKUPCTX");
    OutputFile::ws(o,"\n#undef YYRESTORECTX");
  }
  OutputFile::ws(o,"\n#undef YYLESSTHAN");
  OutputFile::ws(o,"\n#undef YYFILL");
  OutputFile::ws(o,"\n");
  return;
}

Assistant:

void Skeleton::emit_end
	( OutputFile & o
	, bool backup
	, bool backupctx
	) const
{
	o.ws("\n").wind(1).ws("}");
	o.ws("\n").wind(1).ws("if (status == 0) {");
	o.ws("\n").wind(2).ws("if (cursor != eof) {");
	o.ws("\n").wind(3).ws("status = 1;");
	o.ws("\n").wind(3).ws("const long pos = token - input;");
	o.ws("\n").wind(3).ws("fprintf(stderr, \"error: lex_").wstring(name).ws(": unused input strings left at position %ld\\n\", pos);");
	o.ws("\n").wind(2).ws("}");
	o.ws("\n").wind(2).ws("if (i != keys_count) {");
	o.ws("\n").wind(3).ws("status = 1;");
	o.ws("\n").wind(3).ws("fprintf(stderr, \"error: lex_").wstring(name).ws(": unused keys left after %u iterations\\n\", i);");
	o.ws("\n").wind(2).ws("}");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n");
	o.ws("\nend:");
	o.ws("\n").wind(1).ws("free(input);");
	o.ws("\n").wind(1).ws("free(keys);");
	o.ws("\n");
	o.ws("\n").wind(1).ws("return status;");
	o.ws("\n}");
	o.ws("\n");
	o.ws("\n#undef YYCTYPE");
	o.ws("\n#undef YYKEYTYPE");
	o.ws("\n#undef YYPEEK");
	o.ws("\n#undef YYSKIP");
	if (backup)
	{
		o.ws("\n#undef YYBACKUP");
		o.ws("\n#undef YYRESTORE");
	}
	if (backupctx)
	{
		o.ws("\n#undef YYBACKUPCTX");
		o.ws("\n#undef YYRESTORECTX");
	}
	o.ws("\n#undef YYLESSTHAN");
	o.ws("\n#undef YYFILL");
	o.ws("\n");
}